

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O1

void PDHG_Compute_Primal_Feasibility
               (CUPDLPwork *work,cupdlp_float *primalResidual,cupdlp_float *ax,cupdlp_float *x,
               cupdlp_float *dPrimalFeasibility,cupdlp_float *dPrimalObj)

{
  CUPDLPproblem *pCVar1;
  CUPDLPscaling *pCVar2;
  CUPDLPdata *pCVar3;
  cupdlp_int index;
  cupdlp_float alpha;
  int local_3c;
  cupdlp_float local_38;
  
  pCVar1 = work->problem;
  pCVar2 = work->scaling;
  pCVar3 = pCVar1->data;
  cupdlp_dot(work,pCVar3->nCols,x,pCVar1->cost,dPrimalObj);
  *dPrimalObj = *dPrimalObj * pCVar1->sense_origin + pCVar1->offset;
  memcpy(primalResidual,ax,(long)pCVar3->nRows << 3);
  local_38 = -1.0;
  cupdlp_axpy(work,pCVar3->nRows,&local_38,pCVar1->rhs,primalResidual);
  cupdlp_projNeg(primalResidual + pCVar1->nEqs,pCVar3->nRows - pCVar1->nEqs);
  if (pCVar2->ifScaled != 0) {
    cupdlp_edot(primalResidual,work->rowScale,pCVar3->nRows);
  }
  if (work->settings->iInfNormAbsLocalTermination == 0) {
    cupdlp_twoNorm(work,pCVar3->nRows,primalResidual,dPrimalFeasibility);
  }
  else {
    cupdlp_infNormIndex(work,pCVar3->nRows,primalResidual,&local_3c);
    *dPrimalFeasibility = ABS(primalResidual[local_3c]);
  }
  return;
}

Assistant:

void PDHG_Compute_Primal_Feasibility(CUPDLPwork *work, cupdlp_float *primalResidual,
                                    const cupdlp_float *ax, const cupdlp_float *x,
                                    cupdlp_float *dPrimalFeasibility,
                                    cupdlp_float *dPrimalObj) {
  CUPDLPproblem *problem = work->problem;
  CUPDLPdata *lp = problem->data;
  CUPDLPscaling *scaling = work->scaling;

  // primal variable violation

  // todo, add this
  //    *dPrimalObj = Dotprod_Neumaier(problem->cost, x, lp->nCols);
  cupdlp_dot(work, lp->nCols, x, problem->cost, dPrimalObj);
  *dPrimalObj = *dPrimalObj * problem->sense_origin + problem->offset;

#if !defined(CUPDLP_CPU) && USE_KERNELS
  primalResidual = work->buffer2;

  cupdlp_primal_feasibility_kernel_cuda(primalResidual, ax, problem->rhs,
                                        work->rowScale, scaling->ifScaled,
                                        problem->nEqs, lp->nRows);

  cupdlp_twoNorm(work, lp->nRows, primalResidual, dPrimalFeasibility);

#else

  // cupdlp_copy(primalResidual, ax, cupdlp_float, lp->nRows);
  CUPDLP_COPY_VEC(primalResidual, ax, cupdlp_float, lp->nRows);

  // AddToVector(primalResidual, -1.0, problem->rhs, lp->nRows);
  cupdlp_float alpha = -1.0;
  cupdlp_axpy(work, lp->nRows, &alpha, problem->rhs, primalResidual);

  //  double dPrimalFeas = 0.0; // Redundant

  // todo, check
  //  cupdlp_projNegative(primalResidual + problem->nEqs, primalResidual +
  //  problem->nEqs, lp->nRows - problem->nEqs);
  //

  cupdlp_projNeg(primalResidual + problem->nEqs, lp->nRows - problem->nEqs);

  if (scaling->ifScaled) {
    // cupdlp_edot(primalResidual, scaling->rowScale, lp->nRows);
    // cupdlp_edot(primalResidual, scaling->rowScale_gpu, lp->nRows);

    // cupdlp_copy_vec(work->buffer3, scaling->rowScale, cupdlp_float,
    // lp->nRows); cupdlp_edot(primalResidual, work->buffer3, lp->nRows);

    cupdlp_edot(primalResidual, work->rowScale, lp->nRows);
  }

  if (work->settings->iInfNormAbsLocalTermination) {
    cupdlp_int index;
    cupdlp_infNormIndex(work, lp->nRows, primalResidual, &index);
    *dPrimalFeasibility = fabs(primalResidual[index]);

// WIP only allow native for the moment
// #ifdef CUPDLP_CPU
//     *dPrimalFeasibility = fabs(primalResidual[index]);
// #else
//     double res_value = get_fabs_value(primalResidual, index, lp->nRows);
//     *dPrimalFeasibility = fabs(res_value);   
// #endif

  } else {
    cupdlp_twoNorm(work, lp->nRows, primalResidual, dPrimalFeasibility);
  }

#endif
}